

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O0

bool Am_Is_Group_Or_Map(Am_Object *obj)

{
  Am_Object *this;
  bool bVar1;
  bool local_51;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *obj_local;
  
  local_18 = obj;
  Am_Object::Am_Object(&local_20,&Am_Group);
  bVar1 = Am_Object::Is_Instance_Of(obj,&local_20);
  Am_Object::~Am_Object(&local_20);
  this = local_18;
  if (bVar1) {
    obj_local._7_1_ = true;
  }
  else {
    local_51 = false;
    if (Am_Map_ptr != (Am_Object *)0x0) {
      Am_Object::Am_Object(local_38,Am_Map_ptr);
      local_51 = Am_Object::Is_Instance_Of(this,local_38);
      Am_Object::~Am_Object(local_38);
    }
    if (local_51 == false) {
      obj_local._7_1_ = false;
    }
    else {
      obj_local._7_1_ = true;
    }
  }
  return obj_local._7_1_;
}

Assistant:

bool
Am_Is_Group_Or_Map(Am_Object &obj)
{
  if (obj.Is_Instance_Of(Am_Group))
    return true;

  //
  // If Am_Map_ptr is not set, then there are no Am_Maps in this
  // application, so we don't have to check to see if `obj' is an Am_Map.
  //
  if (Am_Map_ptr && obj.Is_Instance_Of(*Am_Map_ptr))
    return true;

  return false;
}